

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::ExpectStackSkip(Recycler *this)

{
  bool bVar1;
  ConfigFlagsTable *pCVar2;
  byte local_23;
  byte local_21;
  bool expectStackSkip;
  Recycler *this_local;
  
  pCVar2 = GetRecyclerFlagsTable(this);
  bVar1 = Js::ConfigFlagsTable::IsEnabled(pCVar2,LeakReportFlag);
  local_21 = 1;
  if (!bVar1) {
    pCVar2 = GetRecyclerFlagsTable(this);
    local_21 = pCVar2->CheckMemoryLeak;
  }
  bVar1 = true;
  if ((local_21 & 1) == 0) {
    bVar1 = this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0;
  }
  local_23 = 1;
  if (!bVar1) {
    local_23 = this->isExternalStackSkippingGC;
  }
  return (bool)(local_23 & 1);
}

Assistant:

bool
Recycler::ExpectStackSkip() const
{
    // Okay to skip the stack scan if we're in leak check mode
    bool expectStackSkip = false;

#ifdef LEAK_REPORT
    expectStackSkip = expectStackSkip || GetRecyclerFlagsTable().IsEnabled(Js::LeakReportFlag);
#endif
#ifdef CHECK_MEMORY_LEAK
    expectStackSkip = expectStackSkip || GetRecyclerFlagsTable().CheckMemoryLeak;
#endif
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
    expectStackSkip = expectStackSkip || (this->objectGraphDumper != nullptr);
#endif

#if defined(INTERNAL_MEM_PROTECT_HEAP_ALLOC)
    expectStackSkip = expectStackSkip || GetRecyclerFlagsTable().MemProtectHeap;
#endif
    return expectStackSkip || isExternalStackSkippingGC;
}